

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandNum_Generator.cc
# Opt level: O1

long __thiscall RandNum_Generator::generator(RandNum_Generator *this,int x,int i,int m)

{
  long lVar1;
  char *pcVar2;
  double dVar3;
  
  if (x < 0) {
    pcVar2 = "y must be a non-negative integer!";
    lVar1 = 0x21;
  }
  else {
    if ((uint)i < 0x100) {
      if (m < 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"m must be a positive integer!",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      dVar3 = floor((double)x * 0.00390625);
      return SUB168(ZEXT416(V[1][((int)dVar3 + i) % 0x100] ^ V[0][i + x & 0xff]) % SEXT816((long)m),
                    0);
    }
    pcVar2 = "i must be a non-negative integer less than 256!";
    lVar1 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return -1;
}

Assistant:

long RandNum_Generator::generator(int x, int i, int m)
{

	long r = 0;
	//cout << "RandNum_Generator::generator" << endl;

	// y is a non-negative integer
	if (x < 0)
	{
		cerr << "y must be a non-negative integer!" << endl;
		return -1;
	}

	if ((i < 0) || (i >= 256 ))
	{
		cerr << "i must be a non-negative integer less than 256!" << endl;
		return -1;
	}

	if (m <= 0)
	{
		cerr << "m must be a positive integer!" << endl;
	}

	//cout << V[0][0] << endl;


	//mod 2^^8 = mod 256


	r = (V[0][(x + i) % 256] ^ V[1][((int)floor((double)x / 256.0) + i) % 256]);
	r =  r % m;

	return r;
}